

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Light::Light(Light *this,Light *param_1)

{
  Light *param_1_local;
  Light *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::vector<double,_std::allocator<double>_>::vector(&this->color,&param_1->color);
  this->intensity = param_1->intensity;
  std::__cxx11::string::string((string *)&this->type,(string *)&param_1->type);
  this->range = param_1->range;
  SpotLight::SpotLight(&this->spot,&param_1->spot);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions,&param_1->extensions);
  Value::Value(&this->extras,&param_1->extras);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

Light() = default;